

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::operator+=(path *this,string_type *x)

{
  impl_string_type iStack_30;
  
  path<std::__cxx11::string,ghc::filesystem::path>((path *)&iStack_30,x,auto_format);
  postprocess_path_with_format(&iStack_30,(format)x);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&iStack_30);
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const string_type& x)
{
    return concat(x);
}